

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

ptr<log_entry> nuraft::inmem_log_store::make_clone(ptr<log_entry> *entry)

{
  buffer *__child_stack;
  void *in_RCX;
  int __flags;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long *in_RSI;
  ptr<log_entry> pVar2;
  log_val_type local_42;
  undefined1 local_41;
  shared_ptr<nuraft::buffer> local_40;
  unsigned_long local_30;
  ulong local_28;
  
  local_28 = ((log_entry *)*in_RSI)->term_;
  __child_stack = log_entry::get_buf((log_entry *)*in_RSI);
  buffer::clone((__fn *)&local_40,__child_stack,__flags,in_RCX);
  local_42 = *(log_val_type *)(*in_RSI + 8);
  local_30 = *(unsigned_long *)(*in_RSI + 0x20);
  (entry->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type,unsigned_long>
            (&(entry->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ,(log_entry **)entry,(allocator<nuraft::log_entry> *)&local_41,&local_28,&local_40,
             &local_42,&local_30);
  _Var1._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entry;
  return (ptr<log_entry>)pVar2.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_entry> inmem_log_store::make_clone(const ptr<log_entry>& entry) {
    // NOTE:
    //   Timestamp is used only when `replicate_log_timestamp_` option is on.
    //   Otherwise, log store does not need to store or load it.
    ptr<log_entry> clone = cs_new<log_entry>
                           ( entry->get_term(),
                             buffer::clone( entry->get_buf() ),
                             entry->get_val_type(),
                             entry->get_timestamp() );
    return clone;
}